

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O3

void __thiscall Assimp::AMFImporter::Clear(AMFImporter *this)

{
  list<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
  *this_00;
  list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_> *this_01
  ;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *plVar1;
  _List_node_base *p_Var2;
  iterator __begin2;
  _List_node_base *p_Var3;
  
  this->mNodeElement_Cur = (CAMFImporter_NodeElement *)0x0;
  (this->mUnit)._M_string_length = 0;
  *(this->mUnit)._M_dataplus._M_p = '\0';
  this_00 = &this->mMaterial_Converted;
  std::__cxx11::
  _List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
  ::_M_clear(&this_00->
              super__List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
            );
  (this->mMaterial_Converted).
  super__List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->mMaterial_Converted).
  super__List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->mMaterial_Converted).
  super__List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
  ._M_impl._M_node._M_size = 0;
  this_01 = &this->mTexture_Converted;
  std::__cxx11::
  _List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>::
  _M_clear(&this_01->
            super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
          );
  (this->mTexture_Converted).
  super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_01;
  (this->mTexture_Converted).
  super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_01;
  (this->mTexture_Converted).
  super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
  ._M_impl._M_node._M_size = 0;
  plVar1 = &this->mNodeElement_List;
  p_Var3 = (this->mNodeElement_List).
           super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)plVar1) {
    do {
      if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
        (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 8))();
      }
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)plVar1);
    p_Var3 = (plVar1->
             super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var3 != (_List_node_base *)plVar1) {
      p_Var2 = p_Var3->_M_next;
      operator_delete(p_Var3);
      p_Var3 = p_Var2;
    }
    (this->mNodeElement_List).
    super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
    (this->mNodeElement_List).
    super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
    (this->mNodeElement_List).
    super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
  }
  return;
}

Assistant:

void AMFImporter::Clear()
{
	mNodeElement_Cur = nullptr;
	mUnit.clear();
	mMaterial_Converted.clear();
	mTexture_Converted.clear();
	// Delete all elements
	if(!mNodeElement_List.empty())
	{
		for(CAMFImporter_NodeElement* ne: mNodeElement_List) { delete ne; }

		mNodeElement_List.clear();
	}
}